

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_STR_zri(DisasContext_conflict1 *s,arg_rri *a)

{
  _Bool _Var1;
  _Bool extraout_AL;
  
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    do_str(s,a->rd * 0x100 + 0xc10,s->sve_len,a->rn,a->imm * s->sve_len);
    return extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_STR_zri(DisasContext *s, arg_rri *a)
{
    if (sve_access_check(s)) {
        int size = vec_full_reg_size(s);
        int off = vec_full_reg_offset(s, a->rd);
        do_str(s, off, size, a->rn, a->imm * size);
    }
    return true;
}